

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void R_MapTiltedPlane(int y,int x1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BYTE *pBVar4;
  byte bVar5;
  byte bVar6;
  int width_00;
  int iVar7;
  uint uVar8;
  float *pfVar9;
  double dVar10;
  double dVar11;
  DWORD stepv_1;
  DWORD stepu_1;
  double endv_1;
  double endu_1;
  double endz_1;
  double left;
  DWORD stepv;
  DWORD stepu;
  double endv;
  double endu;
  double endz;
  double vzstep;
  double uzstep;
  double izstep;
  double startv;
  double startu;
  double startz;
  int umask;
  BYTE ushift;
  uint uStack_40;
  BYTE vshift;
  int i;
  DWORD v;
  DWORD u;
  BYTE *fb;
  double vz;
  double uz;
  double iz;
  int width;
  int x2;
  int x1_local;
  int y_local;
  
  width_00 = spanend[y] - x1;
  pfVar9 = TVector3<float>::operator[](&plane_sz,2);
  fVar1 = *pfVar9;
  pfVar9 = TVector3<float>::operator[](&plane_sz,1);
  fVar2 = *pfVar9;
  iVar7 = centery - y;
  pfVar9 = TVector3<float>::operator[](&plane_sz,0);
  uz = (double)(fVar1 + fVar2 * (float)iVar7 + *pfVar9 * (float)(x1 - centerx));
  if ((plane_shade & 1U) != 0) {
    pfVar9 = TVector3<float>::operator[](&plane_sz,0);
    R_CalcTiltedLighting
              (uz * (double)planelightfloat,
               (uz + (double)(*pfVar9 * (float)width_00)) * (double)planelightfloat,width_00);
  }
  pfVar9 = TVector3<float>::operator[](&plane_su,2);
  fVar1 = *pfVar9;
  pfVar9 = TVector3<float>::operator[](&plane_su,1);
  fVar2 = *pfVar9;
  iVar7 = centery - y;
  pfVar9 = TVector3<float>::operator[](&plane_su,0);
  vz = (double)(fVar1 + fVar2 * (float)iVar7 + *pfVar9 * (float)(x1 - centerx));
  pfVar9 = TVector3<float>::operator[](&plane_sv,2);
  fVar1 = *pfVar9;
  pfVar9 = TVector3<float>::operator[](&plane_sv,1);
  fVar2 = *pfVar9;
  iVar7 = centery - y;
  pfVar9 = TVector3<float>::operator[](&plane_sv,0);
  pBVar4 = dc_destorg;
  fb = (BYTE *)(double)(fVar1 + fVar2 * (float)iVar7 + *pfVar9 * (float)(x1 - centerx));
  iVar7 = ylookup[y] + x1;
  bVar5 = 0x20 - (byte)ds_ybits;
  bVar6 = bVar5 - (byte)ds_xbits;
  uVar8 = (1 << ((byte)ds_xbits & 0x1f)) + -1 << ((byte)ds_ybits & 0x1f);
  pfVar9 = TVector3<float>::operator[](&plane_sz,0);
  fVar1 = *pfVar9;
  pfVar9 = TVector3<float>::operator[](&plane_su,0);
  fVar2 = *pfVar9;
  pfVar9 = TVector3<float>::operator[](&plane_sv,0);
  fVar3 = *pfVar9;
  width = 0;
  izstep = (double)fb * (1.0 / uz);
  startv = vz * (1.0 / uz);
  for (iz._0_4_ = width_00 + 1; 0xf < iz._0_4_; iz._0_4_ = iz._0_4_ + -0x10) {
    uz = (double)(fVar1 * 16.0) + uz;
    vz = (double)(fVar2 * 16.0) + vz;
    fb = (BYTE *)((double)(fVar3 * 16.0) + (double)fb);
    dVar10 = vz * (1.0 / uz);
    dVar11 = (double)fb * (1.0 / uz);
    i = (int)(long)startv + pviewx;
    uStack_40 = (int)(long)izstep + pviewy;
    for (umask = 0xf; -1 < umask; umask = umask + -1) {
      pBVar4[(long)width + (long)iVar7] =
           tiltlighting[width]
           [(int)(uint)ds_source[uStack_40 >> (bVar5 & 0x1f) | (uint)i >> (bVar6 & 0x1f) & uVar8]];
      width = width + 1;
      i = (int)(long)((dVar10 - startv) * 0.0625) + i;
      uStack_40 = (int)(long)((dVar11 - izstep) * 0.0625) + uStack_40;
    }
    izstep = dVar11;
    startv = dVar10;
  }
  if (0 < iz._0_4_) {
    if (iz._0_4_ == 1) {
      pBVar4[(long)width + (long)iVar7] =
           tiltlighting[width]
           [(int)(uint)ds_source[(uint)(long)izstep >> (bVar5 & 0x1f) |
                                 (uint)(long)startv >> (bVar6 & 0x1f) & uVar8]];
    }
    else {
      dVar10 = (double)iz._0_4_;
      pfVar9 = TVector3<float>::operator[](&plane_sz,0);
      fVar1 = *pfVar9;
      pfVar9 = TVector3<float>::operator[](&plane_su,0);
      fVar2 = *pfVar9;
      pfVar9 = TVector3<float>::operator[](&plane_sv,0);
      fVar3 = *pfVar9;
      dVar11 = 1.0 / ((double)fVar1 * dVar10 + uz);
      i = (int)(long)startv + pviewx;
      uStack_40 = (int)(long)izstep + pviewy;
      for (; iz._0_4_ != 0; iz._0_4_ = iz._0_4_ + -1) {
        pBVar4[(long)width + (long)iVar7] =
             tiltlighting[width]
             [(int)(uint)ds_source[uStack_40 >> (bVar5 & 0x1f) | (uint)i >> (bVar6 & 0x1f) & uVar8]]
        ;
        width = width + 1;
        i = (int)(long)((((double)fVar2 * dVar10 + vz) * dVar11 - startv) * (1.0 / dVar10)) + i;
        uStack_40 = (int)(long)((((double)fVar3 * dVar10 + (double)fb) * dVar11 - izstep) *
                               (1.0 / dVar10)) + uStack_40;
      }
    }
  }
  return;
}

Assistant:

void R_MapTiltedPlane (int y, int x1)
{
	int x2 = spanend[y];
	int width = x2 - x1;
	double iz, uz, vz;
	BYTE *fb;
	DWORD u, v;
	int i;

	iz = plane_sz[2] + plane_sz[1]*(centery-y) + plane_sz[0]*(x1-centerx);

	// Lighting is simple. It's just linear interpolation from start to end
	if (plane_shade)
	{
		uz = (iz + plane_sz[0]*width) * planelightfloat;
		vz = iz * planelightfloat;
		R_CalcTiltedLighting (vz, uz, width);
	}

	uz = plane_su[2] + plane_su[1]*(centery-y) + plane_su[0]*(x1-centerx);
	vz = plane_sv[2] + plane_sv[1]*(centery-y) + plane_sv[0]*(x1-centerx);

	fb = ylookup[y] + x1 + dc_destorg;

	BYTE vshift = 32 - ds_ybits;
	BYTE ushift = vshift - ds_xbits;
	int umask = ((1 << ds_xbits) - 1) << ds_ybits;

#if 0		// The "perfect" reference version of this routine. Pretty slow.
			// Use it only to see how things are supposed to look.
	i = 0;
	do
	{
		double z = 1.f/iz;

		u = SQWORD(uz*z) + pviewx;
		v = SQWORD(vz*z) + pviewy;
		ds_colormap = tiltlighting[i];
		fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
		iz += plane_sz[0];
		uz += plane_su[0];
		vz += plane_sv[0];
	} while (--width >= 0);
#else
//#define SPANSIZE 32
//#define INVSPAN 0.03125f
//#define SPANSIZE 8
//#define INVSPAN 0.125f
#define SPANSIZE 16
#define INVSPAN	0.0625f

	double startz = 1.f/iz;
	double startu = uz*startz;
	double startv = vz*startz;
	double izstep, uzstep, vzstep;

	izstep = plane_sz[0] * SPANSIZE;
	uzstep = plane_su[0] * SPANSIZE;
	vzstep = plane_sv[0] * SPANSIZE;
	x1 = 0;
	width++;

	while (width >= SPANSIZE)
	{
		iz += izstep;
		uz += uzstep;
		vz += vzstep;

		double endz = 1.f/iz;
		double endu = uz*endz;
		double endv = vz*endz;
		DWORD stepu = SQWORD((endu - startu) * INVSPAN);
		DWORD stepv = SQWORD((endv - startv) * INVSPAN);
		u = SQWORD(startu) + pviewx;
		v = SQWORD(startv) + pviewy;

		for (i = SPANSIZE-1; i >= 0; i--)
		{
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
			x1++;
			u += stepu;
			v += stepv;
		}
		startu = endu;
		startv = endv;
		width -= SPANSIZE;
	}
	if (width > 0)
	{
		if (width == 1)
		{
			u = SQWORD(startu);
			v = SQWORD(startv);
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
		}
		else
		{
			double left = width;
			iz += plane_sz[0] * left;
			uz += plane_su[0] * left;
			vz += plane_sv[0] * left;

			double endz = 1.f/iz;
			double endu = uz*endz;
			double endv = vz*endz;
			left = 1.f/left;
			DWORD stepu = SQWORD((endu - startu) * left);
			DWORD stepv = SQWORD((endv - startv) * left);
			u = SQWORD(startu) + pviewx;
			v = SQWORD(startv) + pviewy;

			for (; width != 0; width--)
			{
				fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
		}
	}
#endif
}